

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2Synth::renderFrame(V2Synth *this)

{
  size_t __n;
  float fVar1;
  float fVar2;
  uint len;
  ulong uVar3;
  StereoSample *pSVar4;
  int chan;
  ulong uVar5;
  int ch;
  StereoSample *dest;
  int voice;
  long lVar6;
  size_t __n_00;
  V2Voice *this_00;
  float fVar7;
  
  len = (this->instance).SRcFrameSize;
  dest = (this->instance).mixbuf;
  __n = (long)(int)len * 8;
  uVar5 = 0;
  memset(dest,0,__n);
  __n_00 = (long)(int)len << 2;
  memset((this->instance).aux1buf,0,__n_00);
  memset((this->instance).aux2buf,0,__n_00);
  memset((this->instance).auxabuf,0,__n);
  memset((this->instance).auxbbuf,0,__n);
  pSVar4 = (this->instance).chanbuf;
  do {
    if (uVar5 == 0x10) {
      V2Reverb::render(&this->reverb,dest,len);
      V2ModDel::renderAux2Main(&this->delay,dest,len);
      V2DCFilter::renderStereo(&this->dcf,dest,dest,len);
      fVar1 = this->lcfreq;
      fVar2 = this->hcfreq;
      uVar5 = 0;
      uVar3 = 0;
      pSVar4 = dest;
      if (0 < (int)len) {
        uVar3 = (ulong)len;
      }
      for (; uVar5 != uVar3; uVar5 = uVar5 + 1) {
        for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
          fVar7 = pSVar4->ch[lVar6] - this->lcbuf[lVar6];
          this->lcbuf[lVar6] = fVar1 * fVar7 + this->lcbuf[lVar6];
          if ((fVar2 != 1.0) || (NAN(fVar2))) {
            fVar7 = (fVar7 - this->hcbuf[lVar6]) * fVar2 + this->hcbuf[lVar6];
            this->hcbuf[lVar6] = fVar7;
          }
          pSVar4->ch[lVar6] = fVar7;
        }
        pSVar4 = pSVar4 + 1;
      }
      V2Comp::render(&this->compr,dest,len);
      return;
    }
    lVar6 = 0;
    this_00 = this->voicesw;
    while( true ) {
      if (lVar6 == 0x40) goto LAB_00109c3d;
      if (uVar5 == (uint)this->chanmap[lVar6]) break;
      lVar6 = lVar6 + 1;
      this_00 = this_00 + 1;
    }
    memset(pSVar4,0,__n);
    for (; lVar6 != 0x40; lVar6 = lVar6 + 1) {
      if (uVar5 == (uint)this->chanmap[lVar6]) {
        V2Voice::render(this_00,pSVar4,len);
      }
      this_00 = this_00 + 1;
    }
    if (uVar5 == 0xf) {
      ronanCBProcess((syWRonan *)&this->ronan,pSVar4->ch,len);
    }
    V2Chan::process(this->chansw + uVar5,len);
LAB_00109c3d:
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void renderFrame()
    {
        int nsamples = instance.SRcFrameSize;

        // clear output buffer
        memset(instance.mixbuf, 0, nsamples * sizeof(StereoSample));

        // clear aux buffers
        memset(instance.aux1buf, 0, nsamples * sizeof(float));
        memset(instance.aux2buf, 0, nsamples * sizeof(float));
        memset(instance.auxabuf, 0, nsamples * sizeof(StereoSample));
        memset(instance.auxbbuf, 0, nsamples * sizeof(StereoSample));

        // process all channels
        for (int chan = 0; chan < CHANS; chan++)
        {
            // check if any voices are active on this channel
            int voice = 0;
            while (voice < POLY && chanmap[voice] != chan)
                voice++;

            if (voice == POLY)
                continue;

            // clear channel buffer
            memset(instance.chanbuf, 0, nsamples * sizeof(StereoSample));

            // render all voices on this channel
            for (; voice < POLY; voice++)
            {
                if (chanmap[voice] != chan)
                    continue;

                voicesw[voice].render(instance.chanbuf, nsamples);
            }

            // channel 15 -> Ronan
            if (chan == CHANS - 1)
                ronanCBProcess(&ronan, &instance.chanbuf[0].l, nsamples);

            chansw[chan].process(nsamples);
        }

        // global filters
        StereoSample *mix = instance.mixbuf;
        reverb.render(mix, nsamples);
        delay.renderAux2Main(mix, nsamples);
        dcf.renderStereo(mix, mix, nsamples);

        // low cut/high cut
        float lcf = lcfreq, hcf = hcfreq;
        for (int i = 0; i < nsamples; i++)
        {
            for (int ch = 0; ch < 2; ch++)
            {
                // low cut
                float x = mix[i].ch[ch] - lcbuf[ch];
                lcbuf[ch] += lcf * x;

                // high cut
                if (hcf != 1.0f)
                {
                    hcbuf[ch] += hcf * (x - hcbuf[ch]);
                    x = hcbuf[ch];
                }

                mix[i].ch[ch] = x;
            }
        }

        // sum compressor
        compr.render(mix, nsamples);

        DEBUG_PLOT_STEREO(mix, mix, nsamples);
    }